

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

char * do_with_oh<char_const*>
                 (qpdf_data qpdf,qpdf_oh oh,function<const_char_*()> *fallback,
                 function<const_char_*(QPDFObjectHandle_&)> *fn)

{
  undefined1 this [8];
  uint uVar1;
  char *cstr;
  Pipeline *this_00;
  qpdf_error_code_e local_f0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  undefined1 local_e0 [8];
  function<const_char_*(_qpdf_data_*)> local_d8;
  char *ret;
  int local_ac;
  undefined1 local_a8 [16];
  code *local_98;
  Pipeline *pPStack_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_60;
  long local_50;
  undefined8 uStack_48;
  qpdf_oh local_40;
  function<const_char_*()> local_38;
  
  std::function<const_char_*()>::function(&local_38,fallback);
  std::function<const_char_*(QPDFObjectHandle_&)>::function
            ((function<const_char_*(QPDFObjectHandle_&)> *)&local_60,fn);
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (_Manager_type)0x0;
  pPStack_90 = (Pipeline *)0x0;
  local_40 = oh;
  local_a8._0_8_ = operator_new(0x28);
  *(undefined8 *)local_a8._0_8_ = 0;
  *(undefined8 *)(local_a8._0_8_ + 8) = 0;
  *(undefined8 *)(local_a8._0_8_ + 0x10) = 0;
  *(undefined8 *)(local_a8._0_8_ + 0x18) = uStack_48;
  if (local_50 != 0) {
    *(void **)local_a8._0_8_ = local_60._M_unused._M_object;
    *(undefined8 *)(local_a8._0_8_ + 8) = local_60._8_8_;
    *(long *)(local_a8._0_8_ + 0x10) = local_50;
    local_50 = 0;
    uStack_48 = 0;
  }
  *(qpdf_oh *)(local_a8._0_8_ + 0x20) = oh;
  pPStack_90 = (Pipeline *)
               std::
               _Function_handler<const_char_*(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<const_char_*(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  local_e0 = (undefined1  [8])&ret;
  std::function<const_char_*(_qpdf_data_*)>::function
            (&local_d8,(function<const_char_*(_qpdf_data_*)> *)local_a8);
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = operator_new(0x28);
  *(undefined1 (*) [8])local_88._M_unused._0_8_ = local_e0;
  *(long *)((long)local_88._M_unused._0_8_ + 8) = 0;
  *(long *)((long)local_88._M_unused._0_8_ + 0x10) = 0;
  *(long *)((long)local_88._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_88._M_unused._0_8_ + 0x20) = local_d8._M_invoker;
  if (local_d8.super__Function_base._M_manager != (_Manager_type)0x0) {
    *(void **)((long)local_88._M_unused._0_8_ + 8) =
         local_d8.super__Function_base._M_functor._M_unused._M_object;
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 0x10) =
         local_d8.super__Function_base._M_functor._8_8_;
    *(_Manager_type *)((long)local_88._M_unused._0_8_ + 0x18) =
         local_d8.super__Function_base._M_manager;
    local_d8.super__Function_base._M_manager = (_Manager_type)0x0;
    local_d8._M_invoker = (_Invoker_type)0x0;
  }
  pcStack_70 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
             ::_M_manager;
  uVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::_Function_base::~_Function_base(&local_d8.super__Function_base);
  if (1 < uVar1) {
    if (qpdf->silence_errors == false) {
      if (qpdf->oh_error_occurred == false) {
        local_f0[0] = qpdf_e_internal;
        QPDF::getFilename_abi_cxx11_
                  ((string *)local_e0,
                   (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_ac = 0;
        std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
        emplace_back<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                  ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf->warnings,local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   (char (*) [1])0x229c16,&local_ac,
                   (char (*) [129])
                   "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                  );
        std::__cxx11::string::~string((string *)local_e0);
        qpdf->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)local_e0,SUB41(local_f0[0],0));
      this = local_e0;
      cstr = (char *)(**(code **)(*(long *)(qpdf->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this_00 = Pipeline::operator<<((Pipeline *)this,cstr);
      Pipeline::operator<<(this_00,"\n");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
    }
    ret = std::function<const_char_*()>::operator()(&local_38);
  }
  std::_Function_base::~_Function_base((_Function_base *)local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  return ret;
}

Assistant:

static RET
do_with_oh(
    qpdf_data qpdf,
    qpdf_oh oh,
    std::function<RET()> fallback,
    std::function<RET(QPDFObjectHandle&)> fn)
{
    return trap_oh_errors<RET>(qpdf, fallback, [fn, oh](qpdf_data q) {
        auto i = q->oh_cache.find(oh);
        bool result = ((i != q->oh_cache.end()) && (i->second).get());
        if (!result) {
            QTC::TC("qpdf", "qpdf-c invalid object handle");
            throw QPDFExc(
                qpdf_e_internal,
                q->qpdf->getFilename(),
                std::string("C API object handle ") + std::to_string(oh),
                0,
                "attempted access to unknown object handle");
        }
        return fn(*(q->oh_cache[oh]));
    });
}